

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_normalize_space
              (lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t __size;
  void *ptr;
  lyxp_set_node *plVar7;
  lys_node *plVar8;
  ushort uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  byte bVar15;
  ly_ctx *ctx;
  lyd_node *plVar16;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    iVar4 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar4 != 0) {
      return -1;
    }
    pcVar11 = (set->val).str;
    uVar10 = 0;
    bVar2 = false;
    do {
      uVar6 = (ulong)(uVar10 & 0xffff);
      uVar14 = (ulong)(byte)pcVar11[uVar6];
      bVar3 = false;
      if (uVar14 < 0x21) {
        if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
          if (uVar14 == 0) {
            return 0;
          }
        }
        else if (((uVar6 == 0) || (bVar2)) || (bVar3 = true, pcVar11[uVar6 + 1] == '\0'))
        goto LAB_0018386a;
      }
      bVar2 = bVar3;
      uVar10 = (uVar10 & 0xffff) + 1;
    } while( true );
  }
  iVar4 = 0;
  if ((arg_count != 0) && (plVar1 = *args, plVar1->type == LYXP_SET_SNODE_SET)) {
    uVar10 = plVar1->used;
    plVar16 = (lyd_node *)0x0;
    do {
      uVar10 = uVar10 - 1;
      if ((plVar1->val).nodes[uVar10].pos == 1) {
        plVar16 = (plVar1->val).nodes[uVar10].node;
        break;
      }
    } while (uVar10 != 0);
    iVar4 = 0;
    if (plVar16 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar16->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        ctx = param_4->ctx;
        plVar8 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar16->ht);
        pcVar11 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        iVar5 = warn_is_string_type((lys_type *)&plVar16[1].ht);
        iVar4 = 0;
        if (iVar5 != 0) goto LAB_001839d9;
        ctx = param_4->ctx;
        plVar8 = plVar16->schema;
        pcVar11 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      iVar4 = 1;
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,pcVar11,"xpath_normalize_space",plVar8);
    }
  }
LAB_001839d9:
  uVar10 = set->used;
  if ((ulong)uVar10 != 0) {
    lVar12 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar12) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((ulong)uVar10 << 4 != lVar12);
  }
  return iVar4;
LAB_0018386a:
  __size = strlen(pcVar11);
  ptr = malloc(__size);
  if (ptr == (void *)0x0) {
LAB_00183980:
    ly_log(param_4->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space")
    ;
    return -1;
  }
  uVar13 = 0;
  uVar9 = 0;
  bVar2 = false;
LAB_00183889:
  bVar15 = pcVar11[uVar13];
  uVar6 = (ulong)bVar15;
  if (uVar6 < 0x21) {
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      bVar2 = false;
      if (uVar6 != 0) goto LAB_001838c7;
      if (((uVar9 != 0) && (uVar6 = (ulong)*(byte *)((long)ptr + (ulong)(uVar9 - 1)), uVar6 < 0x21))
         && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
        uVar9 = uVar9 - 1;
      }
      plVar7 = (lyxp_set_node *)ly_realloc(ptr,(ulong)uVar9 + 1);
      if (plVar7 != (lyxp_set_node *)0x0) {
        *(undefined1 *)((long)&plVar7->node + (ulong)uVar9) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar7;
        return 0;
      }
      goto LAB_00183980;
    }
    bVar3 = !bVar2;
    bVar15 = 0x20;
    bVar2 = true;
    if (bVar3 && uVar13 != 0) goto LAB_001838c7;
  }
  else {
    bVar2 = false;
LAB_001838c7:
    *(byte *)((long)ptr + (ulong)uVar9) = bVar15;
    uVar9 = uVar9 + 1;
  }
  uVar13 = uVar13 + 1;
  goto LAB_00183889;
}

Assistant:

static int
xpath_normalize_space(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                      struct lyxp_set *set, int options)
{
    uint16_t i, new_used;
    char *new;
    int have_spaces = 0, space_before = 0, ret = EXIT_SUCCESS;
    struct lys_node_leaf *sleaf;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return EXIT_SUCCESS;
}